

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

optional<pbrt::CameraRayDifferential> *
pbrt::CameraBase::GenerateRayDifferential
          (optional<pbrt::CameraRayDifferential> *__return_storage_ptr__,CameraHandle *camera,
          CameraSample sample,SampledWavelengths *lambda)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined4 uVar4;
  undefined8 uVar5;
  uintptr_t uVar6;
  CameraRay *pCVar7;
  char cVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Vector3<float> VVar21;
  anon_class_16_2_908421f6 func;
  anon_class_16_2_908421f6 func_00;
  anon_class_16_2_908421f6 func_01;
  optional<pbrt::CameraRay> ry;
  optional<pbrt::CameraRay> rx;
  optional<pbrt::CameraRay> cr;
  CameraSample local_1c8;
  undefined4 uStack_1b0;
  undefined1 local_1a8 [16];
  Float FStack_198;
  Float FStack_194;
  undefined4 uStack_190;
  uintptr_t local_188;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  Float FStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  Float FStack_160;
  float fStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  float fStack_150;
  optional<pbrt::CameraRayDifferential> *local_148;
  float local_140 [2];
  optional<pbrt::CameraRay> local_138;
  aligned_storage_t<sizeof(pbrt::CameraRay),_alignof(pbrt::CameraRay)> local_f8;
  optional<pbrt::CameraRay> local_b0;
  optional<pbrt::CameraRay> local_70;
  undefined1 auVar18 [56];
  
  local_1a8._0_8_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>;
  func.lambda = lambda;
  func.sample = (CameraSample *)local_1a8;
  local_1a8._8_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.x;
  local_1a8._12_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.y;
  FStack_198 = sample.time;
  FStack_194 = sample.weight;
  TaggedPointer<pbrt::PerspectiveCamera,pbrt::OrthographicCamera,pbrt::SphericalCamera,pbrt::RealisticCamera>
  ::
  Dispatch<pbrt::CameraHandle::GenerateRay(pbrt::CameraSample,pbrt::SampledWavelengths&)const::_lambda(auto:1)_1_>
            (&local_70,camera,func);
  if (local_70.set == false) {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    local_148 = __return_storage_ptr__;
    pCVar7 = pstd::optional<pbrt::CameraRay>::value(&local_70);
    uVar4 = (pCVar7->ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
    uVar2 = *(undefined8 *)&(pCVar7->ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
    local_1a8._0_4_ = (pCVar7->ray).o.super_Tuple3<pbrt::Point3,_float>.x;
    local_1a8._4_4_ = (pCVar7->ray).o.super_Tuple3<pbrt::Point3,_float>.y;
    uVar5 = *(undefined8 *)&(pCVar7->ray).o.super_Tuple3<pbrt::Point3,_float>.z;
    lVar9 = 0;
    FStack_194 = (Float)uVar2;
    uStack_190 = (undefined4)((ulong)uVar2 >> 0x20);
    local_1a8._8_4_ = (undefined4)uVar5;
    local_1a8._12_4_ = (undefined4)((ulong)uVar5 >> 0x20);
    local_188 = (pCVar7->ray).medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                .bits;
    local_1c8.pFilm.super_Tuple2<pbrt::Point2,_float>.x = 0.05;
    local_1c8.pFilm.super_Tuple2<pbrt::Point2,_float>.y = -0.05;
    local_180 = (float)((uint)local_180 & 0xffffff00);
    fStack_17c = 0.0;
    fStack_178 = 0.0;
    fStack_174 = 0.0;
    FStack_170 = 0.0;
    fStack_15c = 0.0;
    uStack_158 = 0;
    uStack_154 = 0;
    fStack_150 = 0.0;
    local_b0.set = false;
    FStack_198 = (Float)uVar4;
    fStack_16c = fStack_17c;
    fStack_168 = fStack_178;
    fStack_164 = fStack_174;
    FStack_160 = FStack_170;
    do {
      if (lVar9 == 8) goto LAB_0035d673;
      fVar1 = *(float *)((long)&local_1c8.pFilm.super_Tuple2<pbrt::Point2,_float>.x + lVar9);
      local_f8._20_4_ = sample.weight;
      local_f8._0_4_ = fVar1 + sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
      local_f8._4_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
      local_f8._8_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.x;
      local_f8._12_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.y;
      local_f8._16_4_ = sample.time;
      auVar18 = ZEXT856(sample._12_8_);
      func_00.lambda = lambda;
      func_00.sample = (CameraSample *)&local_f8;
      TaggedPointer<pbrt::PerspectiveCamera,pbrt::OrthographicCamera,pbrt::SphericalCamera,pbrt::RealisticCamera>
      ::
      Dispatch<pbrt::CameraHandle::GenerateRay(pbrt::CameraSample,pbrt::SampledWavelengths&)const::_lambda(auto:1)_1_>
                (&local_138,camera,func_00);
      pstd::optional<pbrt::CameraRay>::operator=(&local_b0,&local_138);
      pstd::optional<pbrt::CameraRay>::~optional(&local_138);
      lVar9 = lVar9 + 4;
    } while (local_b0.set != true);
    pCVar7 = pstd::optional<pbrt::CameraRay>::value(&local_b0);
    VVar21 = Point3<float>::operator-((Point3<float> *)pCVar7,(Point3<float> *)local_1a8);
    auVar14._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar14._8_56_ = auVar18;
    auVar19._4_4_ = fVar1;
    auVar19._0_4_ = fVar1;
    auVar19._8_4_ = fVar1;
    auVar19._12_4_ = fVar1;
    auVar3 = vdivps_avx(auVar14._0_16_,auVar19);
    fStack_174 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z / fVar1 + (float)local_1a8._8_4_;
    auVar10._0_4_ = auVar3._0_4_ + (float)local_1a8._0_8_;
    auVar10._4_4_ = auVar3._4_4_ + SUB84(local_1a8._0_8_,4);
    auVar10._8_4_ = auVar3._8_4_ + 0.0;
    auVar10._12_4_ = auVar3._12_4_ + 0.0;
    auVar18 = ZEXT856(auVar10._8_8_);
    uVar2 = vmovlps_avx(auVar10);
    fStack_17c = (float)uVar2;
    fStack_178 = (float)((ulong)uVar2 >> 0x20);
    pCVar7 = pstd::optional<pbrt::CameraRay>::value(&local_b0);
    VVar21 = Tuple3<pbrt::Vector3,float>::operator-
                       (&(pCVar7->ray).d.super_Tuple3<pbrt::Vector3,_float>,
                        (Vector3<float> *)(local_1a8 + 0xc));
    auVar15._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar15._8_56_ = auVar18;
    auVar3 = vdivps_avx(auVar15._0_16_,auVar19);
    fStack_15c = VVar21.super_Tuple3<pbrt::Vector3,_float>.z / fVar1 + FStack_194;
    auVar11._0_4_ = auVar3._0_4_ + (float)local_1a8._12_4_;
    auVar11._4_4_ = auVar3._4_4_ + FStack_198;
    auVar11._8_4_ = auVar3._8_4_ + 0.0;
    auVar11._12_4_ = auVar3._12_4_ + 0.0;
    uVar2 = vmovlps_avx(auVar11);
    fStack_164 = (float)uVar2;
    FStack_160 = (Float)((ulong)uVar2 >> 0x20);
LAB_0035d673:
    lVar9 = 0;
    local_138.set = false;
    local_140[0] = 0.05;
    local_140[1] = -0.05;
    do {
      if (lVar9 == 8) goto LAB_0035d7d8;
      fVar1 = *(float *)((long)local_140 + lVar9);
      local_1c8.pLens.super_Tuple2<pbrt::Point2,_float>.x =
           sample.pLens.super_Tuple2<pbrt::Point2,_float>.x;
      local_1c8.pLens.super_Tuple2<pbrt::Point2,_float>.y =
           sample.pLens.super_Tuple2<pbrt::Point2,_float>.y;
      local_1c8.time = sample.time;
      local_1c8.weight = sample.weight;
      local_1c8.pFilm.super_Tuple2<pbrt::Point2,_float>.y =
           fVar1 + sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y;
      local_1c8.pFilm.super_Tuple2<pbrt::Point2,_float>.x =
           sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
      auVar18 = ZEXT856(sample._16_8_);
      func_01.lambda = lambda;
      func_01.sample = &local_1c8;
      TaggedPointer<pbrt::PerspectiveCamera,pbrt::OrthographicCamera,pbrt::SphericalCamera,pbrt::RealisticCamera>
      ::
      Dispatch<pbrt::CameraHandle::GenerateRay(pbrt::CameraSample,pbrt::SampledWavelengths&)const::_lambda(auto:1)_1_>
                ((optional<pbrt::CameraRay> *)&local_f8.__align,camera,func_01);
      pstd::optional<pbrt::CameraRay>::operator=
                (&local_138,(optional<pbrt::CameraRay> *)&local_f8.__align);
      pstd::optional<pbrt::CameraRay>::~optional((optional<pbrt::CameraRay> *)&local_f8.__align);
      lVar9 = lVar9 + 4;
    } while (local_138.set != true);
    pCVar7 = pstd::optional<pbrt::CameraRay>::value(&local_138);
    VVar21 = Point3<float>::operator-((Point3<float> *)pCVar7,(Point3<float> *)local_1a8);
    auVar16._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar16._8_56_ = auVar18;
    auVar20._4_4_ = fVar1;
    auVar20._0_4_ = fVar1;
    auVar20._8_4_ = fVar1;
    auVar20._12_4_ = fVar1;
    auVar3 = vdivps_avx(auVar16._0_16_,auVar20);
    fStack_168 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z / fVar1 + (float)local_1a8._8_4_;
    auVar12._0_4_ = auVar3._0_4_ + (float)local_1a8._0_8_;
    auVar12._4_4_ = auVar3._4_4_ + SUB84(local_1a8._0_8_,4);
    auVar12._8_4_ = auVar3._8_4_ + 0.0;
    auVar12._12_4_ = auVar3._12_4_ + 0.0;
    auVar18 = ZEXT856(auVar12._8_8_);
    uVar2 = vmovlps_avx(auVar12);
    FStack_170 = (Float)uVar2;
    fStack_16c = (float)((ulong)uVar2 >> 0x20);
    pCVar7 = pstd::optional<pbrt::CameraRay>::value(&local_138);
    VVar21 = Tuple3<pbrt::Vector3,float>::operator-
                       (&(pCVar7->ray).d.super_Tuple3<pbrt::Vector3,_float>,
                        (Vector3<float> *)(local_1a8 + 0xc));
    auVar17._0_8_ = VVar21.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar17._8_56_ = auVar18;
    auVar3 = vdivps_avx(auVar17._0_16_,auVar20);
    fStack_150 = VVar21.super_Tuple3<pbrt::Vector3,_float>.z / fVar1 + FStack_194;
    auVar13._0_4_ = auVar3._0_4_ + (float)local_1a8._12_4_;
    auVar13._4_4_ = auVar3._4_4_ + FStack_198;
    auVar13._8_4_ = auVar3._8_4_ + 0.0;
    auVar13._12_4_ = auVar3._12_4_ + 0.0;
    uVar2 = vmovlps_avx(auVar13);
    uStack_158 = (undefined4)uVar2;
    uStack_154 = (undefined4)((ulong)uVar2 >> 0x20);
LAB_0035d7d8:
    uVar6 = local_188;
    cVar8 = '\0';
    if (local_b0.set != false) {
      cVar8 = local_138.set;
    }
    local_180 = (float)CONCAT31(local_180._1_3_,cVar8);
    local_f8._36_8_ = CONCAT44(uStack_158,fStack_15c);
    local_f8._44_8_ = CONCAT44(fStack_150,uStack_154);
    local_1c8.pFilm.super_Tuple2<pbrt::Point2,_float>.x = (float)local_1a8._0_4_;
    local_1c8.pFilm.super_Tuple2<pbrt::Point2,_float>.y = (float)local_1a8._4_4_;
    local_1c8.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)local_1a8._8_4_;
    local_f8._0_4_ = local_180;
    local_f8._4_4_ = fStack_17c;
    local_f8._8_4_ = fStack_178;
    local_f8._12_4_ = fStack_174;
    local_f8._16_4_ = FStack_170;
    local_1c8.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)local_1a8._12_4_;
    local_1c8.time = FStack_198;
    local_1c8.weight = FStack_194;
    uStack_1b0 = uStack_190;
    local_f8._20_4_ = fStack_16c;
    local_f8._24_4_ = fStack_168;
    local_f8._28_4_ = fStack_164;
    local_f8._32_4_ = FStack_160;
    pCVar7 = pstd::optional<pbrt::CameraRay>::value(&local_70);
    __return_storage_ptr__ = local_148;
    local_148->set = true;
    (local_148->optionalValue).__align =
         (anon_struct_8_0_00000001_for___align)local_1c8.pFilm.super_Tuple2<pbrt::Point2,_float>;
    *(ulong *)((long)&local_148->optionalValue + 8) =
         CONCAT44(local_1c8.pLens.super_Tuple2<pbrt::Point2,_float>.y,
                  local_1c8.pLens.super_Tuple2<pbrt::Point2,_float>.x);
    *(ulong *)((long)&local_148->optionalValue + 0xc) =
         CONCAT44(local_1c8.time,local_1c8.pLens.super_Tuple2<pbrt::Point2,_float>.y);
    *(ulong *)((long)&local_148->optionalValue + 0x14) = CONCAT44(uStack_1b0,local_1c8.weight);
    *(uintptr_t *)((long)&local_148->optionalValue + 0x20) = uVar6;
    *(ulong *)((long)&local_148->optionalValue + 0x28) = CONCAT44(local_f8._4_4_,local_f8._0_4_);
    *(ulong *)((long)&local_148->optionalValue + 0x30) = CONCAT44(local_f8._12_4_,local_f8._8_4_);
    *(ulong *)((long)&local_148->optionalValue + 0x38) = CONCAT44(local_f8._20_4_,local_f8._16_4_);
    *(ulong *)((long)&local_148->optionalValue + 0x40) = CONCAT44(local_f8._28_4_,local_f8._24_4_);
    *(ulong *)((long)&local_148->optionalValue + 0x3c) = CONCAT44(local_f8._24_4_,local_f8._20_4_);
    *(ulong *)((long)&local_148->optionalValue + 0x44) = CONCAT44(local_f8._32_4_,local_f8._28_4_);
    *(undefined8 *)((long)&local_148->optionalValue + 0x4c) = local_f8._36_8_;
    *(undefined8 *)((long)&local_148->optionalValue + 0x54) = local_f8._44_8_;
    uVar2 = *(undefined8 *)((pCVar7->weight).values.values + 2);
    *(undefined8 *)((long)&local_148->optionalValue + 0x60) =
         *(undefined8 *)(pCVar7->weight).values.values;
    *(undefined8 *)((long)&local_148->optionalValue + 0x68) = uVar2;
    pstd::optional<pbrt::CameraRay>::~optional(&local_138);
    pstd::optional<pbrt::CameraRay>::~optional(&local_b0);
  }
  pstd::optional<pbrt::CameraRay>::~optional(&local_70);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraRayDifferential> CameraBase::GenerateRayDifferential(
    CameraHandle camera, CameraSample sample, SampledWavelengths &lambda) {
    // Generate regular camera ray _cr_ for ray differential
    pstd::optional<CameraRay> cr = camera.GenerateRay(sample, lambda);
    if (!cr)
        return {};
    RayDifferential rd(cr->ray);

    // Find camera ray after shifting one pixel in the $x$ direction
    pstd::optional<CameraRay> rx;
    for (Float eps : {.05f, -.05f}) {
        CameraSample sshift = sample;
        sshift.pFilm.x += eps;
        // Try to generate ray with _sshift_ and compute $x$ differential
        if (rx = camera.GenerateRay(sshift, lambda); rx) {
            rd.rxOrigin = rd.o + (rx->ray.o - rd.o) / eps;
            rd.rxDirection = rd.d + (rx->ray.d - rd.d) / eps;
            break;
        }
    }

    // Find camera ray after shifting one pixel in the $y$ direction
    pstd::optional<CameraRay> ry;
    for (Float eps : {.05f, -.05f}) {
        CameraSample sshift = sample;
        sshift.pFilm.y += eps;
        if (ry = camera.GenerateRay(sshift, lambda); ry) {
            rd.ryOrigin = rd.o + (ry->ray.o - rd.o) / eps;
            rd.ryDirection = rd.d + (ry->ray.d - rd.d) / eps;
            break;
        }
    }

    // Return approximate ray differential and weight
    rd.hasDifferentials = rx && ry;
    return CameraRayDifferential{rd, cr->weight};
}